

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

bool __thiscall libcellml::Component::removeReset(Component *this,size_t index)

{
  EntityImpl *pEVar1;
  reference pvVar2;
  ResetImpl *this_00;
  ulong uVar3;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  uVar3 = (long)(*(long *)((long)&pEVar1[5].mId.field_2 + 8) -
                pEVar1[5].mId.field_2._M_allocated_capacity) >> 4;
  if (index < uVar3) {
    pvVar2 = std::
             vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
             ::at((vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
                   *)&pEVar1[5].mId.field_2,index);
    this_00 = Reset::pFunc((pvVar2->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
    ParentedEntity::ParentedEntityImpl::removeParent(&this_00->super_ParentedEntityImpl);
    pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl;
    std::
    vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>::
    erase((vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
           *)&pEVar1[5].mId.field_2,
          (shared_ptr<libcellml::Reset> *)
          (index * 0x10 + pEVar1[5].mId.field_2._M_allocated_capacity));
  }
  return index < uVar3;
}

Assistant:

bool Component::removeReset(size_t index)
{
    if (index < pFunc()->mResets.size()) {
        pFunc()->mResets.at(index)->pFunc()->removeParent();
        pFunc()->mResets.erase(pFunc()->mResets.begin() + ptrdiff_t(index));
        return true;
    }
    return false;
}